

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O3

void __thiscall re2::RE2::RE2(RE2 *this,char *pattern)

{
  size_t sVar1;
  StringPiece local_50;
  Options local_40;
  
  (this->pattern_)._M_dataplus._M_p = (pointer)&(this->pattern_).field_2;
  local_50.length_ = 0;
  (this->pattern_)._M_string_length = 0;
  (this->pattern_).field_2._M_local_buf[0] = '\0';
  (this->options_).encoding_ = EncodingUTF8;
  (this->options_).posix_syntax_ = false;
  (this->options_).longest_match_ = false;
  (this->options_).log_errors_ = true;
  (this->options_).max_mem_ = 0x800000;
  (this->options_).literal_ = false;
  (this->options_).never_nl_ = false;
  (this->options_).dot_nl_ = false;
  (this->options_).never_capture_ = false;
  (this->options_).case_sensitive_ = true;
  (this->options_).perl_classes_ = false;
  (this->options_).word_boundary_ = false;
  (this->options_).one_line_ = false;
  (this->prefix_)._M_dataplus._M_p = (pointer)&(this->prefix_).field_2;
  (this->prefix_)._M_string_length = 0;
  (this->prefix_).field_2._M_local_buf[0] = '\0';
  (this->error_arg_)._M_dataplus._M_p = (pointer)&(this->error_arg_).field_2;
  (this->error_arg_)._M_string_length = 0;
  (this->error_arg_).field_2._M_local_buf[0] = '\0';
  this->rprog_once_ = 0;
  this->num_captures_once_ = 0;
  this->named_groups_once_ = 0;
  this->group_names_once_ = 0;
  local_50.ptr_ = pattern;
  if (pattern != (char *)0x0) {
    sVar1 = strlen(pattern);
    local_50.length_ = (int)sVar1;
  }
  local_40.encoding_ = EncodingUTF8;
  local_40.posix_syntax_ = false;
  local_40.longest_match_ = false;
  local_40.log_errors_ = true;
  local_40.max_mem_ = 0x800000;
  local_40.literal_ = false;
  local_40.never_nl_ = false;
  local_40.dot_nl_ = false;
  local_40.never_capture_ = false;
  local_40.case_sensitive_ = true;
  local_40.perl_classes_ = false;
  local_40.word_boundary_ = false;
  local_40.one_line_ = false;
  Init(this,&local_50,&local_40);
  return;
}

Assistant:

RE2::RE2(const char* pattern) {
  Init(pattern, DefaultOptions);
}